

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaDynAr.h
# Opt level: O0

int __thiscall NaDynAr<double>::remove(NaDynAr<double> *this,char *__filename)

{
  item *piVar1;
  bool bVar2;
  undefined4 *puVar3;
  item *piVar4;
  item *n;
  item *p;
  item *in_stack_ffffffffffffffd0;
  item *piVar5;
  
  bVar2 = good(this,(int)__filename);
  if (bVar2) {
    if ((int)__filename == 0) {
      piVar5 = this->pHead;
      this->pHead = this->pHead->pNext;
      if (this->pHead == (item *)0x0) {
        this->pTail = (item *)0x0;
      }
      if (piVar5 != (item *)0x0) {
        item::~item(piVar5);
        operator_delete(piVar5,0x10);
      }
    }
    else {
      piVar4 = fetch_item(this,(int)((ulong)in_stack_ffffffffffffffd0 >> 0x20));
      piVar5 = piVar4->pNext->pNext;
      if (this->pTail == piVar4->pNext) {
        this->pTail = piVar4;
      }
      piVar1 = piVar4->pNext;
      if (piVar1 != (item *)0x0) {
        item::~item(in_stack_ffffffffffffffd0);
        operator_delete(piVar1,0x10);
      }
      piVar4->pNext = piVar5;
    }
    this->nItems = this->nItems + -1;
    return (int)this;
  }
  puVar3 = (undefined4 *)__cxa_allocate_exception(4);
  *puVar3 = 1;
  __cxa_throw(puVar3,&NaException::typeinfo,0);
}

Assistant:

virtual void	remove (int index) {
    item	*p;

    if(!good(index))
      throw(na_out_of_range);
    else if(0 == index){
      p = pHead;

      pHead = pHead->pNext;
      if(NULL == pHead)
        pTail = NULL;

      delete p;
    }
    else{
      p = fetch_item(index - 1);	/* previous */

      item    *n = p->pNext->pNext;

      if(pTail == p->pNext)
	pTail = p;

      delete p->pNext;

      p->pNext = n;
    }
    --nItems;
  }